

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

void __thiscall
sjtu::FileManager<sjtu::TrainManager::stationNameType>::FileManager
          (FileManager<sjtu::TrainManager::stationNameType> *this,string *filepath,uint cache_size)

{
  undefined4 in_EDX;
  string *in_RSI;
  undefined8 *in_RDI;
  string local_38 [36];
  undefined4 local_14;
  
  local_14 = in_EDX;
  FileManager_Base<sjtu::TrainManager::stationNameType>::FileManager_Base
            ((FileManager_Base<sjtu::TrainManager::stationNameType> *)0x123495);
  *in_RDI = &PTR_init_00137bb0;
  in_RDI[0x43] = 0;
  std::__cxx11::string::string(local_38,in_RSI);
  (**(code **)*in_RDI)(in_RDI,local_38,local_14,0);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

FileManager(std::string filepath , unsigned int cache_size) {cache = nullptr , init(filepath , cache_size);}